

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O0

void CompareOnTheFlyNode(comparer_context *comp)

{
  scoped_chunk sVar1;
  bool bVar2;
  uint uVar3;
  Chunk *pCVar4;
  undefined1 local_560 [8];
  sliced_chunk_iterator it;
  sliced_chunk_reader reader;
  string local_528;
  allocator<char> local_501;
  string local_500;
  allocator<char> local_4d9;
  string local_4d8;
  aiMatrix4x4 local_4b4;
  allocator<char> local_471;
  string local_470;
  aiString local_450;
  allocator<char> local_39;
  string local_38;
  scoped_chunk local_18;
  scoped_chunk chunk;
  comparer_context *comp_local;
  
  chunk.ctx = comp;
  scoped_chunk::scoped_chunk(&local_18,comp,"aiNode");
  sVar1.ctx = chunk.ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"mName",&local_39);
  comparer_context::cmp<aiString>(&local_450,sVar1.ctx,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  sVar1 = chunk;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_470,"mTransformation",&local_471);
  comparer_context::cmp<aiMatrix4x4t<float>>(&local_4b4,sVar1.ctx,&local_470);
  std::__cxx11::string::~string((string *)&local_470);
  std::allocator<char>::~allocator(&local_471);
  sVar1 = chunk;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d8,"mNumChildren",&local_4d9)
  ;
  comparer_context::cmp<unsigned_int>(sVar1.ctx,&local_4d8);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::allocator<char>::~allocator(&local_4d9);
  sVar1 = chunk;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_500,"mNumMeshes",&local_501);
  uVar3 = comparer_context::cmp<unsigned_int>(sVar1.ctx,&local_500);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_528,"mMeshes",(allocator<char> *)((long)&reader.ctx + 7));
  comparer_context::cmp<unsigned_int>(sVar1.ctx,(ulong)uVar3,&local_528);
  std::__cxx11::string::~string((string *)&local_528);
  std::allocator<char>::~allocator((allocator<char> *)((long)&reader.ctx + 7));
  std::__cxx11::string::~string((string *)&local_500);
  std::allocator<char>::~allocator(&local_501);
  sliced_chunk_reader::sliced_chunk_reader((sliced_chunk_reader *)&it.end,chunk.ctx);
  sliced_chunk_reader::begin((sliced_chunk_iterator *)local_560,(sliced_chunk_reader *)&it.end);
  while( true ) {
    bVar2 = sliced_chunk_iterator::is_end((sliced_chunk_iterator *)local_560);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    pCVar4 = sliced_chunk_iterator::operator*((sliced_chunk_iterator *)local_560);
    if (pCVar4->first == 0x123c) {
      CompareOnTheFlyNode(chunk.ctx);
    }
    sliced_chunk_iterator::operator++((sliced_chunk_iterator *)local_560);
  }
  sliced_chunk_iterator::~sliced_chunk_iterator((sliced_chunk_iterator *)local_560);
  sliced_chunk_reader::~sliced_chunk_reader((sliced_chunk_reader *)&it.end);
  scoped_chunk::~scoped_chunk(&local_18);
  return;
}

Assistant:

void CompareOnTheFlyNode(comparer_context& comp)    {
    scoped_chunk chunk(comp,"aiNode");
    comp.cmp<aiString>("mName");
    comp.cmp<aiMatrix4x4>("mTransformation");
    comp.cmp<uint32_t>("mNumChildren");
    comp.cmp<uint32_t>(comp.cmp<uint32_t>("mNumMeshes"),"mMeshes");

    sliced_chunk_reader reader(comp);
    for(sliced_chunk_iterator it = reader.begin(); !it.is_end(); ++it) {
        if ((*it).first == ASSBIN_CHUNK_AINODE) {
            CompareOnTheFlyNode(comp);
        }
    }
}